

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.c
# Opt level: O0

void m2v_mult_col_from(m2v *M,int c,int offs,int alpha)

{
  m2v_base *pmVar1;
  int iVar2;
  m2v_base mVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  m2v *in_RDI;
  int r;
  m2v_base m;
  int local_1c;
  
  if (in_ECX == 0) {
    iVar2 = m2v__get_bit(in_RDI,in_ESI);
    mVar3 = m2v__get_mask(iVar2);
    for (local_1c = in_EDX; local_1c < in_RDI->n_row; local_1c = local_1c + 1) {
      pmVar1 = in_RDI->e;
      iVar2 = m2v__get_word(in_RDI,local_1c,in_ESI);
      pmVar1[iVar2] = (mVar3 ^ 0xffffffff) & pmVar1[iVar2];
    }
  }
  return;
}

Assistant:

void m2v_mult_col_from(m2v* M, int c, int offs, int alpha)
{
	assert(0 <= c && c < M->n_col);
	assert(0 <= offs && offs <= M->n_row);

	if (alpha != 0)
		return;
	m2v_base m = ~get_mask(get_bit(M, c));
	for (int r = offs; r < M->n_row; ++r) {
		M->e[get_word(M, r, c)] &= m;
	}
}